

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O2

void __thiscall
sc_core::sc_port<sc_core::sc_signal_inout_if<sc_dt::sc_logic>,_1,_(sc_core::sc_port_policy)0>::
sc_port(sc_port<sc_core::sc_signal_inout_if<sc_dt::sc_logic>,_1,_(sc_core::sc_port_policy)0> *this,
       this_type *parent_)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  
  sc_port_b<sc_core::sc_signal_inout_if<sc_dt::sc_logic>_>::sc_port_b
            (&this->super_sc_port_b<sc_core::sc_signal_inout_if<sc_dt::sc_logic>_>,1,
             SC_ONE_OR_MORE_BOUND);
  (this->super_sc_port_b<sc_core::sc_signal_inout_if<sc_dt::sc_logic>_>).super_sc_port_base.
  super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_00261b30;
  sc_warn_port_constructor();
  sc_port_base::bind((sc_port_base *)this,(int)parent_,__addr,in_ECX);
  return;
}

Assistant:

sc_port( this_type& parent_ )
	: base_type( N, P )
	{ sc_warn_port_constructor(); base_type::bind( parent_ ); }